

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

ValuedAction despot::POMCP::OptimalAction(VNode *vnode)

{
  pointer ppQVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar2;
  ACT_TYPE action;
  ulong uVar3;
  double dVar4;
  ValuedAction VVar5;
  ValuedAction astar;
  ValuedAction local_28;
  
  pvVar2 = VNode::children(vnode);
  ValuedAction::ValuedAction(&astar,-1,-INFINITY);
  for (uVar3 = 0;
      ppQVar1 = (pvVar2->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(pvVar2->
                            super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppQVar1 >> 3);
      uVar3 = uVar3 + 1) {
    dVar4 = QNode::value(ppQVar1[uVar3]);
    if (astar.value < dVar4) {
      dVar4 = QNode::value((pvVar2->
                           super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar3]);
      ValuedAction::ValuedAction(&local_28,(ACT_TYPE)uVar3,dVar4);
      astar.action = local_28.action;
      astar._4_4_ = local_28._4_4_;
      astar.value = local_28.value;
    }
  }
  VVar5._0_8_ = astar._0_8_ & 0xffffffff;
  VVar5.value = astar.value;
  return VVar5;
}

Assistant:

ValuedAction POMCP::OptimalAction(const VNode* vnode) {
	const vector<QNode*>& qnodes = vnode->children();
	ValuedAction astar(-1, Globals::NEG_INFTY);
	for (ACT_TYPE action = 0; action < qnodes.size(); action++) {
		// cout << action << " " << qnodes[action]->value() << " " << qnodes[action]->count() << " " << vnode->count() << endl;
		if (qnodes[action]->value() > astar.value) {
			astar = ValuedAction(action, qnodes[action]->value());
		}
	}
	// assert(atar.action != -1);
	return astar;
}